

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMockerBase<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>::
~FunctionMockerBase(FunctionMockerBase<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *this)

{
  MutexBase *in_RDI;
  MutexLock l;
  UntypedFunctionMockerBase *in_stack_00000240;
  UntypedFunctionMockerBase *in_stack_fffffffffffffff0;
  
  (in_RDI->mutex_).__align = (long)&PTR__FunctionMockerBase_0042ff90;
  GTestMutexLock::GTestMutexLock((GTestMutexLock *)in_stack_fffffffffffffff0,in_RDI);
  UntypedFunctionMockerBase::VerifyAndClearExpectationsLocked(in_stack_00000240);
  Mock::UnregisterLocked(&this->super_UntypedFunctionMockerBase);
  (**(code **)((in_RDI->mutex_).__align + 0x10))();
  GTestMutexLock::~GTestMutexLock((GTestMutexLock *)0x2d7a6e);
  MockSpec<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>::~MockSpec
            ((MockSpec<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *)0x2d7a7b);
  UntypedFunctionMockerBase::~UntypedFunctionMockerBase(in_stack_fffffffffffffff0);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    MutexLock l(&g_gmock_mutex);
    VerifyAndClearExpectationsLocked();
    Mock::UnregisterLocked(this);
    ClearDefaultActionsLocked();
  }